

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

uint8_t wasm::parseLaneIndex(Element *s,size_t lanes)

{
  ulong uVar1;
  string *psVar2;
  IString IVar3;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char *local_60;
  char *end;
  undefined8 local_38;
  undefined8 uStack_30;
  
  IVar3 = Element::str(s);
  uVar1 = strtoll(IVar3.str._M_str,&local_60,10);
  if ((local_60 != IVar3.str._M_str) && (*local_60 == '\0')) {
    if (uVar1 <= lanes) {
      return (uint8_t)uVar1;
    }
    psVar2 = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::to_string((string *)&end,lanes);
    std::operator+(&local_80,"lane index must be less than ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end);
    local_38 = s->line;
    uStack_30 = s->col;
    std::__cxx11::string::string(psVar2,(string *)&local_80);
    *(undefined4 *)(psVar2 + 0x20) = (undefined4)local_38;
    *(undefined4 *)(psVar2 + 0x24) = local_38._4_4_;
    *(undefined4 *)(psVar2 + 0x28) = (undefined4)uStack_30;
    *(undefined4 *)(psVar2 + 0x2c) = uStack_30._4_4_;
    __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
  }
  psVar2 = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Expected lane index",(allocator<char> *)&end);
  local_38 = s->line;
  uStack_30 = s->col;
  std::__cxx11::string::string(psVar2,local_a0);
  *(undefined4 *)(psVar2 + 0x20) = (undefined4)local_38;
  *(undefined4 *)(psVar2 + 0x24) = local_38._4_4_;
  *(undefined4 *)(psVar2 + 0x28) = (undefined4)uStack_30;
  *(undefined4 *)(psVar2 + 0x2c) = uStack_30._4_4_;
  __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

static uint8_t parseLaneIndex(const Element* s, size_t lanes) {
  const char* str = s->str().str.data();
  char* end;
  auto n = static_cast<unsigned long long>(strtoll(str, &end, 10));
  if (end == str || *end != '\0') {
    throw ParseException("Expected lane index", s->line, s->col);
  }
  if (n > lanes) {
    throw ParseException(
      "lane index must be less than " + std::to_string(lanes), s->line, s->col);
  }
  return uint8_t(n);
}